

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTPNCallBase::fold_constants(CTPNCallBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->func_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])();
  this->func_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  (*(this->arglist_->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase.
    _vptr_CTcPrsNodeBase[0xf])(this->arglist_,symtab);
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNCallBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold my function expression */
    func_ = func_->fold_constants(symtab);

    /* fold my argument list */
    arglist_->fold_constants(symtab);

    /* return myself unchanged */
    return this;
}